

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<char,_true,_5> __thiscall
immutable::vector<char,_true,_5>::take(vector<char,_true,_5> *this,size_type_conflict elems)

{
  ref<immutable::rrb<char,_true,_5>_> in_RAX;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  vector<char,_true,_5> local_18;
  
  local_18._impl.ptr =
       (ref<immutable::rrb<char,_true,_5>_>)(ref<immutable::rrb<char,_true,_5>_>)in_RAX.ptr;
  rrb_slice<char,true,5>
            ((immutable *)&local_18,
             (ref<immutable::rrb<char,_true,_5>_> *)CONCAT44(in_register_00000034,elems),0,in_EDX);
  (this->_impl).ptr = (rrb<char,_true,_5> *)local_18;
  if (local_18._impl.ptr != (rrb<char,_true,_5> *)0x0) {
    LOCK();
    (((atomic<unsigned_int> *)((long)local_18._impl.ptr + 0x20))->super___atomic_base<unsigned_int>)
    ._M_i = (((atomic<unsigned_int> *)((long)local_18._impl.ptr + 0x20))->
            super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_18._impl);
  return (vector<char,_true,_5>)(ref<immutable::rrb<char,_true,_5>_>)this;
}

Assistant:

vector take(size_type elems) const
        {       
        return rrb_slice(_impl, 0, elems);
        }